

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O2

void __thiscall Gillespie::DeleteReaction(Gillespie *this,int index)

{
  pointer psVar1;
  range_error *this_00;
  ulong uVar2;
  double dVar3;
  
  if (-1 < index) {
    uVar2 = (ulong)index;
    psVar1 = (this->reactions_).
             super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar2 < (ulong)((long)(this->reactions_).
                              super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
      dVar3 = (double)(**(psVar1[uVar2].super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_vptr_Reaction)();
      this->alpha_sum_ = this->alpha_sum_ - dVar3;
      std::vector<double,_std::allocator<double>_>::erase
                (&this->alpha_list_,
                 (const_iterator)
                 ((this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar2));
      std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::erase
                (&this->reactions_,
                 (this->reactions_).
                 super__Vector_base<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2);
      return;
    }
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error
            (this_00,"Gillespie: Reaction index out of range for reaction deletion.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void Gillespie::DeleteReaction(int index) {
  if (index >= reactions_.size() || index < 0) {
    throw std::range_error(
        "Gillespie: Reaction index out of range for reaction deletion.");
  }
  // Update alpha sum
  alpha_sum_ -= reactions_[index]->CalculatePropensity();
  // Remove from alpha list
  alpha_list_.erase(alpha_list_.begin() + index);
  // Remove from reactions list
  reactions_.erase(reactions_.begin() + index);
}